

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-predicate.c
# Opt level: O3

_Bool monster_can_be_scared(monster *mon)

{
  monster_group_role mVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t wVar4;
  
  _Var2 = flag_has_dbg(mon->race->flags,0xc,0x5a,"mon->race->flags","RF_NO_FEAR");
  if ((_Var2) || (mVar1 = mon->group_info[0].role, mVar1 == MON_GROUP_BODYGUARD)) {
    _Var2 = false;
  }
  else if (mVar1 == MON_GROUP_SERVANT) {
    uVar3 = Rand_div(3);
    _Var2 = uVar3 != 0;
  }
  else {
    wVar4 = monster_primary_group_size(cave,mon);
    do {
      wVar4 = wVar4 + L'\xffffffff';
      _Var2 = wVar4 == L'\0';
      if (_Var2) {
        return _Var2;
      }
      uVar3 = Rand_div(0x14);
    } while (uVar3 != 0);
  }
  return _Var2;
}

Assistant:

bool monster_can_be_scared(const struct monster *mon)
{
	if (rf_has(mon->race->flags, RF_NO_FEAR)) return false;
	switch (mon->group_info[PRIMARY_GROUP].role) {
		case MON_GROUP_BODYGUARD: return false;
		case MON_GROUP_SERVANT:	return one_in_(3) ? false : true;
		default: {
			int count = monster_primary_group_size(cave, mon) - 1;
			while (count--) {
				if (one_in_(20)) return false;
			}
		}
	}
	return true;
}